

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-square.c
# Opt level: O1

void square_destroy(chunk_conflict *c,loc grid)

{
  uint32_t uVar1;
  wchar_t feat;
  
  uVar1 = Rand_div(200);
  feat = L'\x15';
  if ((0x13 < (int)uVar1) && (feat = L'\x12', 0x45 < (int)uVar1)) {
    feat = (uint)((int)uVar1 < 100) * 0x10 + L'\x01';
  }
  square_set_feat(c,grid,feat);
  return;
}

Assistant:

void square_destroy(struct chunk *c, struct loc grid) {
	int feat = FEAT_FLOOR;
	int r = randint0(200);

	if (r < 20)
		feat = FEAT_GRANITE;
	else if (r < 70)
		feat = FEAT_QUARTZ;
	else if (r < 100)
		feat = FEAT_MAGMA;

	square_set_feat(c, grid, feat);
}